

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiTexture *pTexture)

{
  char *sz;
  aiTexture *pTexture_local;
  ValidateDSProcess *this_local;
  
  if (pTexture->pcData == (aiTexel *)0x0) {
    ReportError(this,"aiTexture::pcData is NULL");
  }
  if (pTexture->mHeight == 0) {
    if (pTexture->mWidth == 0) {
      ReportError(this,"aiTexture::mWidth is zero (compressed texture)");
    }
    if (pTexture->achFormatHint[3] == '\0') {
      if (pTexture->achFormatHint[0] == '.') {
        ReportWarning(this,
                      "aiTexture::achFormatHint should contain a file extension without a leading dot (format hint: %s)."
                      ,pTexture->achFormatHint);
      }
    }
    else {
      ReportWarning(this,"aiTexture::achFormatHint must be zero-terminated");
    }
  }
  else if (pTexture->mWidth == 0) {
    ReportError(this,"aiTexture::mWidth is zero (aiTexture::mHeight is %i, uncompressed texture)",
                (ulong)pTexture->mHeight);
  }
  if (((((pTexture->achFormatHint[0] < 'A') || ('Z' < pTexture->achFormatHint[0])) &&
       ((pTexture->achFormatHint[1] < 'A' || ('Z' < pTexture->achFormatHint[1])))) &&
      ((pTexture->achFormatHint[2] < 'A' || ('Z' < pTexture->achFormatHint[2])))) &&
     ((pTexture->achFormatHint[3] < 'A' || ('Z' < pTexture->achFormatHint[3])))) {
    return;
  }
  ReportError(this,"aiTexture::achFormatHint contains non-lowercase letters");
}

Assistant:

void ValidateDSProcess::Validate( const aiTexture* pTexture)
{
    // the data section may NEVER be NULL
    if (!pTexture->pcData)  {
        ReportError("aiTexture::pcData is NULL");
    }
    if (pTexture->mHeight)
    {
        if (!pTexture->mWidth){
        	ReportError("aiTexture::mWidth is zero (aiTexture::mHeight is %i, uncompressed texture)",
        			pTexture->mHeight);
        }
    }
    else
    {
        if (!pTexture->mWidth) {
            ReportError("aiTexture::mWidth is zero (compressed texture)");
        }
        if ('\0' != pTexture->achFormatHint[3]) {
            ReportWarning("aiTexture::achFormatHint must be zero-terminated");
        }
        else if ('.'  == pTexture->achFormatHint[0])    {
            ReportWarning("aiTexture::achFormatHint should contain a file extension "
                "without a leading dot (format hint: %s).",pTexture->achFormatHint);
        }
    }

    const char* sz = pTexture->achFormatHint;
    if ((sz[0] >= 'A' && sz[0] <= 'Z') ||
        (sz[1] >= 'A' && sz[1] <= 'Z') ||
        (sz[2] >= 'A' && sz[2] <= 'Z') ||
        (sz[3] >= 'A' && sz[3] <= 'Z')) {
        ReportError("aiTexture::achFormatHint contains non-lowercase letters");
    }
}